

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O2

void cleanup_stores(void)

{
  owner *poVar1;
  object_buy *poVar2;
  store *psVar3;
  owner *p;
  object_buy *p_00;
  ulong uVar4;
  
  if (stores != (store *)0x0) {
    for (uVar4 = 0; psVar3 = stores, uVar4 < z_info->store_max; uVar4 = uVar4 + 1) {
      mem_free(stores[uVar4].always_table);
      mem_free(psVar3[uVar4].normal_table);
      p = psVar3[uVar4].owners;
      while (p != (owner *)0x0) {
        poVar1 = p->next;
        string_free(p->name);
        mem_free(p);
        p = poVar1;
      }
      p_00 = psVar3[uVar4].buy;
      while (p_00 != (object_buy *)0x0) {
        poVar2 = p_00->next;
        mem_free(p_00);
        p_00 = poVar2;
      }
      string_free(psVar3[uVar4].name);
    }
    mem_free(stores);
    return;
  }
  return;
}

Assistant:

static void cleanup_stores(void)
{
	struct owner *o, *o_next;
	struct object_buy *buy, *buy_next;
	int i;

	if (!stores)
		return;

	/* Free the store tables and owners */
	for (i = 0; i < z_info->store_max; i++) {
		/* Get the store */
		struct store *store = &stores[i];

		/* Free the store inventory */
		mem_free(store->always_table);
		mem_free(store->normal_table);

		for (o = store->owners; o; o = o_next) {
			o_next = o->next;
			string_free(o->name);
			mem_free(o);
		}

		for (buy = store->buy; buy; buy = buy_next) {
			buy_next = buy->next;
			mem_free(buy);
		}

		string_free((void *)store->name);
	}
	mem_free(stores);
}